

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O3

int main(void)

{
  __time_t _Var1;
  int iVar2;
  uint __val;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  int *piVar6;
  ulong uVar7;
  long *plVar8;
  uint uVar9;
  uint uVar10;
  uint __uval;
  string filename;
  string __str;
  timespec local_b0;
  long local_a0;
  undefined8 uStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  media::EasyScreenCapturer::GetInstance();
  _Var1 = local_b0.tv_sec;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"test0.bmp","");
  (**(code **)(*(long *)_Var1 + 0x18))(_Var1,&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.tv_nsec !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.tv_nsec);
  }
  media::EasyScreenCapturer::GetInstance();
  _Var1 = local_b0.tv_sec;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"test1.bmp","");
  (**(code **)(*(long *)_Var1 + 0x18))(_Var1,&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.tv_nsec !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.tv_nsec);
  }
  media::EasyScreenCapturer::GetInstance();
  _Var1 = local_b0.tv_sec;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"test2.bmp","");
  (**(code **)(*(long *)_Var1 + 0x18))(_Var1,&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.tv_nsec !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.tv_nsec);
  }
  media::EasyScreenCapturer::GetInstance();
  _Var1 = local_b0.tv_sec;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"test_1.bmp","");
  iVar2 = (**(code **)(*(long *)_Var1 + 0x10))(_Var1,&local_90,0,0,0x556,0x300);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.tv_nsec !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.tv_nsec);
  }
  media::EasyScreenCapturer::GetInstance();
  _Var1 = local_b0.tv_sec;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"test_2.bmp","");
  iVar2 = (**(code **)(*(long *)_Var1 + 0x10))(_Var1,&local_90,100,100,0x4f2,0x29c);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.tv_nsec !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.tv_nsec);
  }
  uVar9 = 1;
  uVar10 = 0;
  do {
    __val = uVar9;
    uVar7 = (ulong)__val;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"img/test_","");
    uVar9 = 1;
    if (8 < uVar10) {
      uVar10 = 4;
      do {
        uVar9 = uVar10;
        uVar3 = (uint)uVar7;
        if (uVar3 < 100) {
          uVar9 = uVar9 - 2;
          goto LAB_0010256a;
        }
        if (uVar3 < 1000) {
          uVar9 = uVar9 - 1;
          goto LAB_0010256a;
        }
        if (uVar3 < 10000) goto LAB_0010256a;
        uVar7 = uVar7 / 10000;
        uVar10 = uVar9 + 4;
      } while (99999 < uVar3);
      uVar9 = uVar9 + 1;
    }
LAB_0010256a:
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar9);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,uVar9,__val);
    uVar7 = 0xf;
    if (local_50 != local_40) {
      uVar7 = local_40[0];
    }
    if (uVar7 < (ulong)(local_68 + local_48)) {
      uVar7 = 0xf;
      if (local_70 != local_60) {
        uVar7 = local_60[0];
      }
      if (uVar7 < (ulong)(local_68 + local_48)) goto LAB_001025e3;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
    }
    else {
LAB_001025e3:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
    }
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_a0 = *plVar4;
      uStack_98 = puVar5[3];
      local_b0.tv_sec = (__time_t)&local_a0;
    }
    else {
      local_a0 = *plVar4;
      local_b0.tv_sec = (__time_t)*puVar5;
    }
    local_b0.tv_nsec = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar8 = plVar4 + 2;
    if ((long *)*plVar4 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar4[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((long *)local_b0.tv_sec != &local_a0) {
      operator_delete((void *)local_b0.tv_sec);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    media::EasyScreenCapturer::GetInstance();
    (**(code **)(*(long *)local_b0.tv_sec + 0x18))(local_b0.tv_sec,&local_90);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.tv_nsec !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.tv_nsec);
    }
    local_b0.tv_sec = 0;
    local_b0.tv_nsec = 50000000;
    do {
      iVar2 = nanosleep(&local_b0,&local_b0);
      if (iVar2 != -1) break;
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    uVar9 = __val + 1;
    uVar10 = __val;
    if (__val + 1 == 0x3e9) {
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    media::EasyScreenCapturer::GetInstance()->CaptureFullScreenAsBmp("test0.bmp");
    media::EasyScreenCapturer::GetInstance()->CaptureFullScreenAsBmp("test1.bmp");
    media::EasyScreenCapturer::GetInstance()->CaptureFullScreenAsBmp("test2.bmp");
    std::cout << media::EasyScreenCapturer::GetInstance()->CaptureScreenAsBmp("test_1.bmp", 0, 0, 1366, 768) << std::endl;
    std::cout << media::EasyScreenCapturer::GetInstance()->CaptureScreenAsBmp("test_2.bmp", 100, 100, 1266, 668) << std::endl;
    int i = 0;
    while (i++ < 1000) {
        std::string filename = std::string("img/test_") + std::to_string(i) + ".bmp";
        media::EasyScreenCapturer::GetInstance()->CaptureFullScreenAsBmp(filename);
        std::this_thread::sleep_for(std::chrono::milliseconds(50)); //20fps
    }

    return 0;
}